

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

void __thiscall GlobOpt::ValueNumberObjectType(GlobOpt *this,Opnd *dstOpnd,Instr *instr)

{
  OpCode OVar1;
  Func *this_00;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  BailOutKind BVar4;
  RegOpnd *pRVar5;
  ProfiledInstr *pPVar6;
  JITTimeConstructorCache *this_01;
  Value *pVVar7;
  JITTypeHolder type;
  Opnd *this_02;
  StackSym *pSVar8;
  ValueInfo *this_03;
  undefined4 *puVar9;
  StackSym *typeSym_1;
  StackSym *typeSym;
  StackSym *srcTypeSym;
  Opnd *srcOpnd;
  Value *newValue;
  StackSym *dstTypeSym;
  StackSym *objSym;
  JITTimeConstructorCache *ctorCache;
  bool isCtorInlined;
  Instr *instr_local;
  Opnd *dstOpnd_local;
  GlobOpt *this_local;
  
  bVar3 = IR::Opnd::IsRegOpnd(dstOpnd);
  if (bVar3) {
    pRVar5 = IR::Opnd::AsRegOpnd(dstOpnd);
    bVar3 = StackSym::IsTypeSpec(pRVar5->m_sym);
    if (!bVar3) {
      bVar3 = IR::Instr::IsNewScObjectInstr(instr);
      if (bVar3) {
        sourceContextId = Func::GetSourceContextId(this->func);
        functionId = Func::GetLocalFunctionId(this->func);
        bVar3 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_01eafdf0,ObjTypeSpecNewObjPhase,sourceContextId,functionId
                          );
        if ((bVar3) && (bVar3 = IR::Instr::HasBailOutInfo(instr), bVar3)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                             ,0x683,
                             "(!Js::Configuration::Global.flags.Off.IsEnabled(((Js::ObjTypeSpecNewObjPhase)), ((this->func)->GetSourceContextId()), ((this->func)->GetLocalFunctionId())) || !instr->HasBailOutInfo())"
                             ,
                             "!PHASE_OFF(Js::ObjTypeSpecNewObjPhase, this->func) || !instr->HasBailOutInfo()"
                            );
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        bVar3 = IR::Instr::HasBailOutInfo(instr);
        if (bVar3) {
          bVar3 = IR::Instr::IsProfiledInstr(instr);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                               ,0x687,"(instr->IsProfiledInstr())","instr->IsProfiledInstr()");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 0;
          }
          BVar4 = IR::Instr::GetBailOutKind(instr);
          if (BVar4 != BailOutFailedCtorGuardCheck) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                               ,0x688,"(instr->GetBailOutKind() == IR::BailOutFailedCtorGuardCheck)"
                               ,"instr->GetBailOutKind() == IR::BailOutFailedCtorGuardCheck");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 0;
          }
          OVar1 = instr->m_opcode;
          this_00 = instr->m_func;
          pPVar6 = IR::Instr::AsProfiledInstr(instr);
          this_01 = Func::GetConstructorCache(this_00,(pPVar6->u).field_3.fldInfoData.f1);
          if ((this_01 == (JITTimeConstructorCache *)0x0) ||
             ((OVar1 != NewScObjectNoCtor &&
              (bVar3 = JITTimeConstructorCache::IsTypeFinal(this_01), !bVar3)))) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                               ,0x68c,
                               "(ctorCache != nullptr && (isCtorInlined || ctorCache->IsTypeFinal()))"
                               ,
                               "ctorCache != nullptr && (isCtorInlined || ctorCache->IsTypeFinal())"
                              );
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 0;
          }
          pRVar5 = IR::Opnd::AsRegOpnd(dstOpnd);
          pSVar8 = EnsureObjectTypeSym(this,pRVar5->m_sym);
          pVVar7 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,&pSVar8->super_Sym);
          if (pVVar7 != (Value *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                               ,0x690,
                               "(this->currentBlock->globOptData.FindValue(dstTypeSym) == nullptr)",
                               "this->currentBlock->globOptData.FindValue(dstTypeSym) == nullptr");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 0;
          }
          type = JITTimeConstructorCache::GetType(this_01);
          SetObjectTypeFromTypeSym
                    (this,pSVar8,type,(EquivalentTypeSet *)0x0,(BasicBlock *)0x0,false);
        }
      }
      else {
        srcOpnd = (Opnd *)0x0;
        this_02 = IR::Instr::GetSrc1(instr);
        if ((instr->m_opcode == Ld_A) && (bVar3 = IR::Opnd::IsRegOpnd(this_02), bVar3)) {
          pRVar5 = IR::Opnd::AsRegOpnd(this_02);
          bVar3 = StackSym::IsTypeSpec(pRVar5->m_sym);
          if (!bVar3) {
            pRVar5 = IR::Opnd::AsRegOpnd(this_02);
            bVar3 = StackSym::HasObjectTypeSym(pRVar5->m_sym);
            if (bVar3) {
              pRVar5 = IR::Opnd::AsRegOpnd(this_02);
              pSVar8 = StackSym::GetObjectTypeSym(pRVar5->m_sym);
              srcOpnd = (Opnd *)GlobOptBlockData::FindValue
                                          (&this->currentBlock->globOptData,&pSVar8->super_Sym);
            }
          }
        }
        if (srcOpnd == (Opnd *)0x0) {
          pRVar5 = IR::Opnd::AsRegOpnd(dstOpnd);
          bVar3 = StackSym::HasObjectTypeSym(pRVar5->m_sym);
          if (bVar3) {
            pRVar5 = IR::Opnd::AsRegOpnd(dstOpnd);
            pSVar8 = StackSym::GetObjectTypeSym(pRVar5->m_sym);
            GlobOptBlockData::ClearSymValue(&this->currentBlock->globOptData,&pSVar8->super_Sym);
          }
        }
        else {
          this_03 = ::Value::GetValueInfo((Value *)srcOpnd);
          bVar3 = ValueInfo::IsJsType(this_03);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                               ,0x6af,"(newValue->GetValueInfo()->IsJsType())",
                               "newValue->GetValueInfo()->IsJsType()");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 0;
          }
          pRVar5 = IR::Opnd::AsRegOpnd(dstOpnd);
          StackSym::HasObjectTypeSym(pRVar5->m_sym);
          pRVar5 = IR::Opnd::AsRegOpnd(dstOpnd);
          pSVar8 = EnsureObjectTypeSym(this,pRVar5->m_sym);
          GlobOptBlockData::SetValue
                    (&this->currentBlock->globOptData,(Value *)srcOpnd,&pSVar8->super_Sym);
        }
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::ValueNumberObjectType(IR::Opnd *dstOpnd, IR::Instr *instr)
{
    if (!dstOpnd->IsRegOpnd())
    {
        return;
    }

    if (dstOpnd->AsRegOpnd()->m_sym->IsTypeSpec())
    {
        return;
    }

    if (instr->IsNewScObjectInstr())
    {
        // If we have a NewScObj* for which we have a valid constructor cache we know what type the created object will have.
        // Let's produce the type value accordingly so we don't insert a type check and bailout in the constructor and
        // potentially further downstream.
        Assert(!PHASE_OFF(Js::ObjTypeSpecNewObjPhase, this->func) || !instr->HasBailOutInfo());

        if (instr->HasBailOutInfo())
        {
            Assert(instr->IsProfiledInstr());
            Assert(instr->GetBailOutKind() == IR::BailOutFailedCtorGuardCheck);

            bool isCtorInlined = instr->m_opcode == Js::OpCode::NewScObjectNoCtor;
            JITTimeConstructorCache * ctorCache = instr->m_func->GetConstructorCache(static_cast<Js::ProfileId>(instr->AsProfiledInstr()->u.profileId));
            Assert(ctorCache != nullptr && (isCtorInlined || ctorCache->IsTypeFinal()));

            StackSym* objSym = dstOpnd->AsRegOpnd()->m_sym;
            StackSym* dstTypeSym = EnsureObjectTypeSym(objSym);
            Assert(this->currentBlock->globOptData.FindValue(dstTypeSym) == nullptr);

            SetObjectTypeFromTypeSym(dstTypeSym, ctorCache->GetType(), nullptr);
        }
    }
    else
    {
        // If the dst opnd is a reg that has a type sym associated with it, then we are either killing
        // the type's existing value or (in the case of a reg copy) assigning it the value of
        // the src's type sym (if any). If the dst doesn't have a type sym, but the src does, let's
        // give dst a new type sym and transfer the value.
        Value *newValue = nullptr;
        IR::Opnd * srcOpnd = instr->GetSrc1();

        if (instr->m_opcode == Js::OpCode::Ld_A && srcOpnd->IsRegOpnd() &&
            !srcOpnd->AsRegOpnd()->m_sym->IsTypeSpec() && srcOpnd->AsRegOpnd()->m_sym->HasObjectTypeSym())
        {
            StackSym *srcTypeSym = srcOpnd->AsRegOpnd()->m_sym->GetObjectTypeSym();
            newValue = this->currentBlock->globOptData.FindValue(srcTypeSym);
        }

        if (newValue == nullptr)
        {
            if (dstOpnd->AsRegOpnd()->m_sym->HasObjectTypeSym())
            {
                StackSym * typeSym = dstOpnd->AsRegOpnd()->m_sym->GetObjectTypeSym();
                this->currentBlock->globOptData.ClearSymValue(typeSym);
            }
        }
        else
        {
            Assert(newValue->GetValueInfo()->IsJsType());
            StackSym * typeSym;
            if (!dstOpnd->AsRegOpnd()->m_sym->HasObjectTypeSym())
            {
                typeSym = nullptr;
            }
            typeSym = EnsureObjectTypeSym(dstOpnd->AsRegOpnd()->m_sym);
            this->currentBlock->globOptData.SetValue(newValue, typeSym);
        }
    }
}